

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLineBspline.cpp
# Opt level: O3

void __thiscall
chrono::geometry::ChLineBspline::ArchiveOUT(ChLineBspline *this,ChArchiveOut *marchive)

{
  ChNameValue<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>
  local_38;
  
  ChArchiveOut::VersionWrite<chrono::geometry::ChLineBspline>(marchive);
  ChLine::ArchiveOUT(&this->super_ChLine,marchive);
  local_38._value = &this->points;
  local_38._name = "points";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChVector<double>>(marchive,&local_38);
  local_38._value =
       (vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *)&this->p;
  local_38._name = "p";
  local_38._flags = '\0';
  (*(marchive->super_ChArchive)._vptr_ChArchive[3])(marchive,&local_38);
  local_38._value =
       (vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *)&this->closed
  ;
  local_38._name = "closed";
  local_38._flags = '\0';
  (*(marchive->super_ChArchive)._vptr_ChArchive[2])(marchive,&local_38);
  return;
}

Assistant:

void ChLineBspline::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChLineBspline>();
    // serialize parent class
    ChLine::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(points);
    ////marchive << CHNVP(knots); //**TODO MATRIX DESERIALIZATION
    marchive << CHNVP(p);
	marchive << CHNVP(closed);
}